

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

uchar * MeCab::Darts::_resize<unsigned_char>(uchar *ptr,size_t n,size_t l,uchar v)

{
  size_t i;
  uchar *puVar1;
  size_t sVar2;
  size_t i_1;
  
  puVar1 = (uchar *)operator_new__(l);
  for (sVar2 = 0; n != sVar2; sVar2 = sVar2 + 1) {
    puVar1[sVar2] = ptr[sVar2];
  }
  for (; n < l; n = n + 1) {
    puVar1[n] = v;
  }
  if (ptr != (uchar *)0x0) {
    operator_delete__(ptr);
  }
  return puVar1;
}

Assistant:

inline T* _resize(T* ptr, size_t n, size_t l, T v) {
  T *tmp = new T[l];
  for (size_t i = 0; i < n; ++i) tmp[i] = ptr[i];
  for (size_t i = n; i < l; ++i) tmp[i] = v;
  delete [] ptr;
  return tmp;
}